

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O3

Vec_Int_t * Acec_ManCollectXorRoots(Gia_Man_t *p,Vec_Int_t *vXors)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  void *__ptr;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  iVar5 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  if (iVar5 == 0) {
    uVar3 = vXors->nSize;
    if ((int)uVar3 < 1) {
      return p_00;
    }
    __ptr = (void *)0x0;
  }
  else {
    __ptr = calloc(1,(long)iVar5 << 2);
    uVar3 = vXors->nSize;
    if ((int)uVar3 < 1) {
      if (__ptr == (void *)0x0) {
        return p_00;
      }
      goto LAB_0066fde8;
    }
  }
  uVar6 = iVar5 * 0x20;
  uVar7 = 1;
  do {
    if ((int)uVar3 <= (int)uVar7) {
LAB_0066fe28:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar4 = vXors->pArray;
    uVar2 = piVar4[uVar7];
    if (((int)uVar2 < 0) || ((int)uVar6 <= (int)uVar2)) {
LAB_0066fe09:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
    }
    puVar1 = (uint *)((long)__ptr + (ulong)(uVar2 >> 5) * 4);
    *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
    if (uVar3 <= uVar7 + 1) goto LAB_0066fe28;
    uVar2 = piVar4[uVar7 + 1];
    if (((int)uVar2 < 0) || (uVar6 <= uVar2)) goto LAB_0066fe09;
    puVar1 = (uint *)((long)__ptr + (ulong)(uVar2 >> 5) * 4);
    *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
    if (uVar3 <= uVar7 + 2) goto LAB_0066fe28;
    uVar2 = piVar4[uVar7 + 2];
    if (((int)uVar2 < 0) || (uVar6 <= uVar2)) goto LAB_0066fe09;
    puVar1 = (uint *)((long)__ptr + (ulong)(uVar2 >> 5) * 4);
    *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
    iVar5 = uVar7 + 3;
    uVar7 = uVar7 + 4;
  } while (iVar5 < (int)uVar3);
  uVar8 = 0;
  do {
    uVar7 = vXors->pArray[uVar8];
    if (((int)uVar7 < 0) || ((int)uVar6 <= (int)uVar7)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
    }
    if ((*(uint *)((long)__ptr + (ulong)(uVar7 >> 5) * 4) >> (uVar7 & 0x1f) & 1) == 0) {
      Vec_IntPush(p_00,uVar7);
      uVar3 = vXors->nSize;
    }
    uVar7 = (int)uVar8 + 4;
    uVar8 = (ulong)uVar7;
  } while ((int)uVar7 < (int)uVar3);
LAB_0066fde8:
  free(__ptr);
  return p_00;
}

Assistant:

Vec_Int_t * Acec_ManCollectXorRoots( Gia_Man_t * p, Vec_Int_t * vXors )
{
    Vec_Int_t * vXorRoots = Vec_IntAlloc( 100 );
    Vec_Bit_t * vIns = Vec_BitStart( Gia_ManObjNum(p) );  int i;
    // marks box inputs
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
    {
        Vec_BitWriteEntry( vIns, Vec_IntEntry(vXors, 4*i+1), 1 );
        Vec_BitWriteEntry( vIns, Vec_IntEntry(vXors, 4*i+2), 1 );
        Vec_BitWriteEntry( vIns, Vec_IntEntry(vXors, 4*i+3), 1 );
    }
    // collect roots
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
        if ( !Vec_BitEntry(vIns, Vec_IntEntry(vXors, 4*i)) )
            Vec_IntPush( vXorRoots, Vec_IntEntry(vXors, 4*i) );
    Vec_BitFree( vIns );
    return vXorRoots;
}